

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crm_test.cc
# Opt level: O0

int test_check_label(void)

{
  code *pcVar1;
  char *__s;
  CrmCheckLabelRequestType *pCVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_151;
  int ret;
  HttpTestListener *local_130;
  HttpTestListener *listener;
  string local_120;
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [55];
  allocator<char> local_99;
  string local_98 [32];
  CrmCheckLabelRequestType *local_78;
  Crm *crm;
  undefined1 local_68 [7];
  CrmCheckLabelResponseType resp;
  CrmCheckLabelRequestType req;
  
  aliyun::CrmCheckLabelRequestType::CrmCheckLabelRequestType((CrmCheckLabelRequestType *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"cn-hangzhou",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"my_appid",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"my_secret",&local_f9);
  pCVar2 = (CrmCheckLabelRequestType *)aliyun::Crm::CreateCrmClient(local_98,local_d0,local_f8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  local_78 = pCVar2;
  if (pCVar2 == (CrmCheckLabelRequestType *)0x0) {
    aliyun::CrmCheckLabelRequestType::~CrmCheckLabelRequestType
              ((CrmCheckLabelRequestType *)local_68);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Crm::SetProxyHost((Crm *)pCVar2,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Crm::SetUseTls((Crm *)local_78,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_check_label_response;
  local_130 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_151);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_151);
  HttpTestListener::Start(local_130);
  std::__cxx11::string::operator=((string *)local_68,"PK");
  std::__cxx11::string::operator=((string *)(req.pk.field_2._M_local_buf + 8),"LabelName");
  std::__cxx11::string::operator=((string *)(req.label_name.field_2._M_local_buf + 8),"LabelSeries")
  ;
  aliyun::Crm::CheckLabel
            (local_78,(CrmCheckLabelResponseType *)local_68,(CrmErrorInfo *)((long)&crm + 7));
  HttpTestListener::WaitComplete(local_130);
  pHVar3 = local_130;
  if (local_130 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_130);
    operator_delete(pHVar3,0x180);
  }
  pCVar2 = local_78;
  if (local_78 != (CrmCheckLabelRequestType *)0x0) {
    aliyun::Crm::~Crm((Crm *)local_78);
    operator_delete(pCVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_check_label() {
  CrmCheckLabelRequestType req;
  CrmCheckLabelResponseType resp;
  Crm* crm = Crm::CreateCrmClient("cn-hangzhou", "my_appid", "my_secret");
  if(!crm) return 0;
  crm->SetProxyHost("127.0.0.1:12234");
  crm->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_check_label_response);
  listener->Start();
  req.pk = "PK";
  req.label_name = "LabelName";
  req.label_series = "LabelSeries";
  int ret = crm->CheckLabel(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete crm;
}